

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImRect *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow *pIVar5;
  
  pIVar3 = GImGui;
  GImGui->NavLayer = layer;
  if (layer == ImGuiNavLayer_Main) {
    pIVar5 = ImGui::NavRestoreLastChildNavWindow(pIVar3->NavWindow);
    pIVar3->NavWindow = pIVar5;
  }
  pIVar4 = GImGui;
  pIVar5 = pIVar3->NavWindow;
  if (pIVar5->NavLastIds[layer] != 0) {
    ImGui::SetNavID(pIVar5->NavLastIds[layer],layer,0);
    IVar2 = pIVar5->NavRectRel[layer].Max;
    pIVar1 = pIVar4->NavWindow->NavRectRel + (int)layer;
    pIVar1->Min = pIVar5->NavRectRel[layer].Min;
    pIVar1->Max = IVar2;
    pIVar4->NavMousePosDirty = true;
    pIVar4->NavDisableHighlight = false;
    pIVar4->NavDisableMouseHover = true;
    return;
  }
  ImGui::NavInitWindow(pIVar5,true);
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
        ImGui::SetNavIDWithRectRel(window->NavLastIds[layer], layer, 0, g.NavWindow->NavRectRel[layer]);
    else
        ImGui::NavInitWindow(window, true);
}